

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::calcStatesPartialsFixedScaling
          (BeagleCPUImpl<double,_1,_1> *this,double *destP,int *states1,double *matrices1,
          double *partials2,double *matrices2,double *scaleFactors,int startPattern,int endPattern)

{
  double dVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  long lVar10;
  double *pdVar11;
  int iVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  double *pdVar21;
  ulong uVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int local_c0;
  double *local_b0;
  double *local_a8;
  
  uVar3 = this->kStateCount;
  uVar4 = this->kCategoryCount;
  lVar23 = (long)(int)(uVar3 + 1);
  iVar5 = this->kPatternCount;
  iVar6 = this->kPartialsPaddedStateCount;
  iVar7 = this->kMatrixSize;
  local_c0 = 0;
  local_b0 = matrices2 + 2;
  iVar12 = startPattern * iVar6;
  local_a8 = matrices2;
  for (uVar17 = 0; uVar17 != (~((int)uVar4 >> 0x1f) & uVar4); uVar17 = uVar17 + 1) {
    pdVar21 = partials2 + iVar12;
    pdVar13 = destP + (iVar5 * (int)uVar17 + startPattern) * iVar6;
    for (lVar19 = (long)startPattern; lVar19 < endPattern; lVar19 = lVar19 + 1) {
      dVar1 = scaleFactors[lVar19];
      iVar8 = states1[lVar19];
      pdVar11 = local_a8;
      pdVar15 = local_b0;
      lVar18 = (long)local_c0;
      for (uVar22 = 0; uVar22 != (~((int)uVar3 >> 0x1f) & uVar3); uVar22 = uVar22 + 1) {
        lVar10 = iVar8 + lVar18;
        auVar24 = ZEXT816(0) << 0x40;
        pdVar14 = pdVar21;
        pdVar20 = pdVar11;
        for (lVar16 = 0; auVar9 = auVar24, lVar16 < (int)uVar3 / 4 << 2; lVar16 = lVar16 + 4) {
          pdVar14 = pdVar14 + 4;
          pdVar20 = pdVar20 + 4;
          auVar24 = vfmadd231pd_fma(auVar24,*(undefined1 (*) [16])(pdVar15 + lVar16 + -2),
                                    *(undefined1 (*) [16])(pdVar21 + lVar16));
          auVar24 = vfmadd231pd_fma(auVar24,*(undefined1 (*) [16])(pdVar15 + lVar16),
                                    *(undefined1 (*) [16])(pdVar21 + lVar16 + 2));
        }
        while (lVar16 < (int)uVar3) {
          auVar25._8_8_ = 0;
          auVar25._0_8_ = *pdVar20;
          lVar16 = lVar16 + 1;
          pdVar20 = pdVar20 + 1;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *pdVar14;
          auVar9 = vfmadd231sd_fma(auVar9,auVar25,auVar2);
          pdVar14 = pdVar14 + 1;
        }
        auVar24 = vshufpd_avx(auVar24,auVar24,1);
        lVar18 = lVar18 + lVar23;
        pdVar15 = pdVar15 + lVar23;
        pdVar11 = pdVar11 + lVar23;
        *pdVar13 = (1.0 / dVar1) * matrices1[lVar10] * (auVar24._0_8_ + auVar9._0_8_);
        pdVar13 = pdVar13 + 1;
      }
      *pdVar13 = 0.0;
      pdVar21 = pdVar21 + iVar6;
      pdVar13 = pdVar13 + 1;
    }
    local_c0 = local_c0 + iVar7;
    iVar12 = iVar12 + iVar5 * iVar6;
    local_b0 = local_b0 + iVar7;
    local_a8 = local_a8 + iVar7;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesPartialsFixedScaling(REALTYPE* destP,
                                                                       const int* states1,
                                                                       const REALTYPE* matrices1,
                                                                       const REALTYPE* partials2,
                                                                       const REALTYPE* matrices2,
                                                                       const REALTYPE* scaleFactors,
                                                                       int startPattern,
                                                                       int endPattern) {

    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {
            int w = l * kMatrixSize;
            int state1 = states1[k];
            REALTYPE oneOverScaleFactor = REALTYPE(1.0) / scaleFactors[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE tmp = matrices1[w + state1];
                REALTYPE sumA = 0.0;
                REALTYPE sumB = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sumA += matrices2Ptr[j + 0] * partials2Ptr[j + 0];
                    sumB += matrices2Ptr[j + 1] * partials2Ptr[j + 1];
                    sumA += matrices2Ptr[j + 2] * partials2Ptr[j + 2];
                    sumB += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }
                for (; j < kStateCount; j++) {
                    sumA += matrices2Ptr[j] * partials2Ptr[j];
                }

                w += matrixIncr;

                *(destPtr++) = tmp * (sumA + sumB) * oneOverScaleFactor;
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    *(destPtr++) = 0.0;
                }
            }
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}